

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_fan_calib(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  envy_bios_power_fan_calib_entry *peVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  uVar9 = (bios->power).fan_calib.offset;
  iVar7 = -0x16;
  if ((ulong)uVar9 != 0) {
    if (uVar9 < bios->length) {
      uVar1 = bios->data[uVar9];
      (bios->power).fan_calib.version = uVar1;
    }
    else {
      (bios->power).fan_calib.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar1 = (bios->power).fan_calib.version;
    }
    if (uVar1 == '\x10') {
      uVar6 = (bios->power).fan_calib.offset;
      uVar9 = uVar6 + 1;
      uVar5 = bios->length;
      if (uVar9 < uVar5) {
        (bios->power).fan_calib.hlen = bios->data[uVar9];
        iVar7 = 0;
      }
      else {
        (bios->power).fan_calib.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
        uVar6 = (bios->power).fan_calib.offset;
        uVar5 = bios->length;
        iVar7 = -0xe;
      }
      uVar9 = uVar6 + 2;
      if (uVar9 < uVar5) {
        (bios->power).fan_calib.rlen = bios->data[uVar9];
        iVar10 = 0;
      }
      else {
        (bios->power).fan_calib.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
        uVar6 = (bios->power).fan_calib.offset;
        uVar5 = bios->length;
        iVar10 = -0xe;
      }
      if (uVar6 + 3 < uVar5) {
        bVar2 = bios->data[uVar6 + 3];
        (bios->power).fan_calib.entriesnum = bVar2;
        iVar4 = 0;
      }
      else {
        (bios->power).fan_calib.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        bVar2 = (bios->power).fan_calib.entriesnum;
        iVar4 = -0xe;
      }
      (bios->power).fan_calib.valid = (iVar10 == 0 && iVar7 == 0) && iVar4 == 0;
      peVar3 = (envy_bios_power_fan_calib_entry *)calloc((ulong)bVar2,0x18);
      (bios->power).fan_calib.entries = peVar3;
      if (bVar2 != 0) {
        lVar8 = 0;
        uVar11 = 0;
        do {
          uVar9 = (uint)(bios->power).fan_calib.rlen * (int)uVar11 +
                  (uint)(bios->power).fan_calib.hlen + (bios->power).fan_calib.offset;
          peVar3 = (bios->power).fan_calib.entries;
          *(uint *)((long)&peVar3->offset + lVar8) = uVar9;
          if (uVar9 < bios->length) {
            (&peVar3->enable)[lVar8] = bios->data[uVar9];
          }
          else {
            (&peVar3->enable)[lVar8] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
          }
          peVar3 = (bios->power).fan_calib.entries;
          if (uVar9 + 1 < bios->length) {
            (&peVar3->mode)[lVar8] = bios->data[uVar9 + 1];
          }
          else {
            (&peVar3->mode)[lVar8] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          peVar3 = (bios->power).fan_calib.entries;
          uVar5 = bios->length;
          if (uVar9 + 3 < uVar5) {
            *(ushort *)((long)&peVar3->unk02 + lVar8) =
                 CONCAT11(bios->data[uVar9 + 3],bios->data[uVar9 + 2]);
          }
          else {
            *(undefined2 *)((long)&peVar3->unk02 + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            peVar3 = (bios->power).fan_calib.entries;
            uVar5 = bios->length;
          }
          if (uVar9 + 5 < uVar5) {
            *(ushort *)((long)&peVar3->unk04 + lVar8) =
                 CONCAT11(bios->data[uVar9 + 5],bios->data[uVar9 + 4]);
          }
          else {
            *(undefined2 *)((long)&peVar3->unk04 + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            peVar3 = (bios->power).fan_calib.entries;
            uVar5 = bios->length;
          }
          if (uVar9 + 7 < uVar5) {
            *(ushort *)((long)&peVar3->unk06 + lVar8) =
                 CONCAT11(bios->data[uVar9 + 7],bios->data[uVar9 + 6]);
          }
          else {
            *(undefined2 *)((long)&peVar3->unk06 + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            peVar3 = (bios->power).fan_calib.entries;
            uVar5 = bios->length;
          }
          if (uVar9 + 9 < uVar5) {
            *(ushort *)((long)&peVar3->pwm_freq + lVar8) =
                 CONCAT11(bios->data[uVar9 + 9],bios->data[uVar9 + 8]);
          }
          else {
            *(undefined2 *)((long)&peVar3->pwm_freq + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            peVar3 = (bios->power).fan_calib.entries;
            uVar5 = bios->length;
          }
          if (uVar9 + 0xb < uVar5) {
            *(ushort *)((long)&peVar3->duty_max + lVar8) =
                 CONCAT11(bios->data[uVar9 + 0xb],bios->data[uVar9 + 10]);
          }
          else {
            *(undefined2 *)((long)&peVar3->duty_max + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            peVar3 = (bios->power).fan_calib.entries;
            uVar5 = bios->length;
          }
          if (uVar9 + 0xd < uVar5) {
            *(ushort *)((long)&peVar3->duty_offset + lVar8) =
                 CONCAT11(bios->data[uVar9 + 0xd],bios->data[uVar9 + 0xc]);
          }
          else {
            *(undefined2 *)((long)&peVar3->duty_offset + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            peVar3 = (bios->power).fan_calib.entries;
            uVar5 = bios->length;
          }
          if (uVar9 + 0xf < uVar5) {
            *(ushort *)((long)&peVar3->unk0e + lVar8) =
                 CONCAT11(bios->data[uVar9 + 0xf],bios->data[uVar9 + 0xe]);
          }
          else {
            *(undefined2 *)((long)&peVar3->unk0e + lVar8) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          bVar2 = (bios->power).fan_calib.rlen;
          if (0x11 < bVar2) {
            peVar3 = (bios->power).fan_calib.entries;
            if (uVar9 + 0x11 < bios->length) {
              *(ushort *)((long)&peVar3->unk10 + lVar8) =
                   CONCAT11(bios->data[uVar9 + 0x11],bios->data[uVar9 + 0x10]);
            }
            else {
              *(undefined2 *)((long)&peVar3->unk10 + lVar8) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
              bVar2 = (bios->power).fan_calib.rlen;
            }
            if (0x13 < bVar2) {
              peVar3 = (bios->power).fan_calib.entries;
              if (uVar9 + 0x13 < bios->length) {
                *(ushort *)((long)&peVar3->unk12 + lVar8) =
                     CONCAT11(bios->data[uVar9 + 0x13],bios->data[uVar9 + 0x12]);
              }
              else {
                *(undefined2 *)((long)&peVar3->unk12 + lVar8) = 0;
                fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
              }
            }
          }
          uVar11 = uVar11 + 1;
          lVar8 = lVar8 + 0x18;
        } while (uVar11 < (bios->power).fan_calib.entriesnum);
      }
      iVar7 = 0;
    }
    else {
      envy_bios_parse_power_fan_calib_cold_1();
    }
  }
  return iVar7;
}

Assistant:

int envy_bios_parse_power_fan_calib(struct envy_bios *bios) {
	struct envy_bios_power_fan_calib *fan_calib = &bios->power.fan_calib;
	int i, err = 0;

	if (!fan_calib->offset)
		return -EINVAL;

	bios_u8(bios, fan_calib->offset + 0x0, &fan_calib->version);
	switch(fan_calib->version) {
	case 0x10:
		err |= bios_u8(bios, fan_calib->offset + 0x1, &fan_calib->hlen);
		err |= bios_u8(bios, fan_calib->offset + 0x2, &fan_calib->rlen);
		err |= bios_u8(bios, fan_calib->offset + 0x3, &fan_calib->entriesnum);
		fan_calib->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN CALIBRATION table version 0x%x\n", fan_calib->version);
		return -EINVAL;
	};

	err = 0;
	fan_calib->entries = calloc(fan_calib->entriesnum, sizeof(struct envy_bios_power_fan_calib_entry));
	for (i = 0; i < fan_calib->entriesnum; i++) {
		uint32_t data = fan_calib->offset + fan_calib->hlen + i * fan_calib->rlen;

		fan_calib->entries[i].offset = data;
		bios_u8(bios, data + 0x00, &fan_calib->entries[i].enable);
		bios_u8(bios, data + 0x01, &fan_calib->entries[i].mode);
		bios_u16(bios, data + 0x02, &fan_calib->entries[i].unk02);
		bios_u16(bios, data + 0x04, &fan_calib->entries[i].unk04);
		bios_u16(bios, data + 0x06, &fan_calib->entries[i].unk06);
		bios_u16(bios, data + 0x08, &fan_calib->entries[i].pwm_freq); /* not used by the blob */
		bios_u16(bios, data + 0x0a, &fan_calib->entries[i].duty_max);
		bios_u16(bios, data + 0x0c, (uint16_t*) &fan_calib->entries[i].duty_offset);
		bios_u16(bios, data + 0x0e, &fan_calib->entries[i].unk0e);

		if (fan_calib->rlen >= 0x12)
			bios_u16(bios, data + 0x10, &fan_calib->entries[i].unk10);

		if (fan_calib->rlen >= 0x14)
			bios_u16(bios, data + 0x12, &fan_calib->entries[i].unk12);
	}

	return 0;
}